

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

SUNErrCode N_VEnableLinearSumVectorArray_ManyVector(N_Vector v,int tf)

{
  int tf_local;
  N_Vector v_local;
  
  if (tf == 0) {
    v->ops->nvlinearsumvectorarray =
         (_func_SUNErrCode_int_sunrealtype_N_Vector_ptr_sunrealtype_N_Vector_ptr_N_Vector_ptr *)0x0;
  }
  else {
    v->ops->nvlinearsumvectorarray = N_VLinearSumVectorArray_ManyVector;
  }
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VEnableLinearSumVectorArray)(N_Vector v, sunbooleantype tf)
{
  /* enable/disable operation */
  if (tf)
  {
    v->ops->nvlinearsumvectorarray = MVAPPEND(N_VLinearSumVectorArray);
  }
  else { v->ops->nvlinearsumvectorarray = NULL; }

  /* return success */
  return SUN_SUCCESS;
}